

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)

{
  SQNativeClosure *x;
  SQWeakRef *in_RDX;
  SQObjectPtr *in_RDI;
  SQUnsignedInteger i;
  SQNativeClosure *nc;
  SQVM *this;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  _func_int **in_stack_ffffffffffffffc8;
  SQSharedState *in_stack_ffffffffffffffd0;
  SQWeakRef *local_28;
  
  x = SQNativeClosure::Create
                (in_stack_ffffffffffffffd0,(SQFUNCTION)in_stack_ffffffffffffffc8,
                 (SQInteger)in_stack_ffffffffffffffc0);
  x->_nparamscheck = 0;
  for (local_28 = (SQWeakRef *)0x0; local_28 < in_RDX;
      local_28 = (SQWeakRef *)((long)&(local_28->super_SQRefCounted)._vptr_SQRefCounted + 1)) {
    SQVM::Top((SQVM *)0x11589f);
    SQObjectPtr::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    SQVM::Pop((SQVM *)0x1158c6);
  }
  this = (SQVM *)&stack0xffffffffffffffc8;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,x);
  SQVM::Push(this,in_RDI);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  return;
}

Assistant:

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)
{
    SQNativeClosure *nc = SQNativeClosure::Create(_ss(v), func,nfreevars);
    nc->_nparamscheck = 0;
    for(SQUnsignedInteger i = 0; i < nfreevars; i++) {
        nc->_outervalues[i] = v->Top();
        v->Pop();
    }
    v->Push(SQObjectPtr(nc));
}